

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_plu_l(matd_plu_t *mlu)

{
  uint uVar1;
  uint uVar2;
  matd_t *pmVar3;
  matd_t *pmVar4;
  int i;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pmVar3 = mlu->lu;
  pmVar4 = matd_create(pmVar3->nrows,pmVar3->ncols);
  uVar1 = pmVar3->nrows;
  for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
    uVar2 = pmVar4->ncols;
    iVar5 = (int)uVar6;
    pmVar4[(ulong)((uVar2 + 1) * iVar5) + 1].nrows = 0;
    pmVar4[(ulong)((uVar2 + 1) * iVar5) + 1].ncols = 0x3ff00000;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pmVar4[(ulong)(uVar2 * iVar5 + (int)uVar7) + 1] =
           pmVar3[(ulong)(pmVar3->ncols * iVar5 + (int)uVar7) + 1];
    }
  }
  return pmVar4;
}

Assistant:

matd_t *matd_plu_l(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;

    matd_t *L = matd_create(lu->nrows, lu->ncols);
    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(L, i, i) = 1;

        for (int j = 0; j < i; j++) {
            MATD_EL(L, i, j) = MATD_EL(lu, i, j);
        }
    }

    return L;
}